

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *pNtk,Vec_Ptr_t *vOrder)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iLit1;
  Gia_Man_t *p;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  long *plVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int gFanins [16];
  int local_78 [18];
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                  ,0x155,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                  ,0x156,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  Abc_NtkFillTemp(pNtk);
  p = Gia_ManStart(0x8000);
  pcVar5 = Abc_UtilStrsav(pNtk->pName);
  p->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar5;
  Gia_ManHashAlloc(p);
  for (iVar12 = 0; iVar12 < pNtk->vPis->nSize; iVar12 = iVar12 + 1) {
    pAVar6 = Abc_NtkPi(pNtk,iVar12);
    iVar2 = Gia_ManAppendCi(p);
    *(int *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray] + 0x40) = iVar2;
  }
  iVar12 = 0;
  do {
    if (vOrder->nSize <= iVar12) {
      for (iVar12 = 0; iVar12 < pNtk->vPos->nSize; iVar12 = iVar12 + 1) {
        pAVar6 = Abc_NtkPo(pNtk,iVar12);
        Gia_ManAppendCo(p,*(int *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] +
                                  0x40));
      }
      Gia_ManHashStop(p);
      Gia_ManSetRegNum(p,0);
      pGVar10 = Gia_ManCleanup(p);
      Gia_ManStop(p);
      Abc_NtkCountAndNodes(vOrder);
      printf("%8d -> ");
      Gia_ManPrintStats(pGVar10,(Gps_Par_t *)0x0);
      return pGVar10;
    }
    plVar7 = (long *)Vec_PtrEntry(vOrder,iVar12);
    uVar3 = *(uint *)((long)plVar7 + 0x14) & 0xf;
    if (uVar3 == 7) {
      iVar2 = *(int *)((long)plVar7 + 0x1c);
      if (0x10 < iVar2) {
        __assert_fail("Abc_ObjFaninNum(pObj) <= 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x167,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      pcVar5 = (char *)plVar7[7];
      iVar4 = Abc_SopGetVarNum(pcVar5);
      if (iVar2 != iVar4) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x168,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      uVar8 = (ulong)*(uint *)((long)plVar7 + 0x1c);
      if ((int)*(uint *)((long)plVar7 + 0x1c) < 1) {
        uVar8 = 0;
      }
      uVar11 = 0;
      while (uVar8 != uVar11) {
        iVar2 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                  (long)*(int *)(plVar7[4] + uVar11 * 4) * 8) + 0x40);
        local_78[uVar11] = iVar2;
        uVar11 = uVar11 + 1;
        if (iVar2 < 0) {
          __assert_fail("gFanins[k] >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x16c,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
      }
      iVar2 = Abc_NtkDeriveFlatGiaSop(p,local_78,pcVar5);
      *(int *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[6] * 8) +
              0x40) = iVar2;
    }
    else {
      if (uVar3 != 10 && (*(uint *)((long)plVar7 + 0x14) & 0xe) != 8) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x171,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      lVar13 = plVar7[7];
      if (*(int *)((long)plVar7 + 0x1c) != *(int *)(*(long *)(lVar13 + 0x28) + 4)) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x174,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      if (*(int *)((long)plVar7 + 0x2c) != *(int *)(*(long *)(lVar13 + 0x30) + 4)) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x175,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      pGVar10 = *(Gia_Man_t **)(lVar13 + 0x158);
      if (*(int *)((long)plVar7 + 0x1c) != pGVar10->vCis->nSize - pGVar10->nRegs) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x182,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      if (*(int *)((long)plVar7 + 0x2c) != pGVar10->vCos->nSize - pGVar10->nRegs) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x183,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      Gia_ManFillValue(pGVar10);
      pGVar10->pObjs->Value = 0;
      for (lVar13 = 0; lVar13 < *(int *)((long)plVar7 + 0x1c); lVar13 = lVar13 + 1) {
        if ((long)pGVar10->vCis->nSize - (long)pGVar10->nRegs <= lVar13) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        plVar1 = *(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                           (long)*(int *)(plVar7[4] + lVar13 * 4) * 8);
        uVar3 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)plVar1[4] * 8) + 0x40);
        iVar2 = Vec_IntEntry(pGVar10->vCis,(int)lVar13);
        pGVar9 = Gia_ManObj(pGVar10,iVar2);
        pGVar9->Value = uVar3;
      }
      for (iVar2 = 0; iVar2 < pGVar10->nObjs; iVar2 = iVar2 + 1) {
        pGVar9 = Gia_ManObj(pGVar10,iVar2);
        if (pGVar9 == (Gia_Obj_t *)0x0) break;
        if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
          iVar4 = Gia_ObjFanin0Copy(pGVar9);
          uVar3 = (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20);
          iLit1 = Abc_LitNotCond(pGVar9[-(ulong)(uVar3 & 0x1fffffff)].Value,uVar3 >> 0x1d & 1);
          uVar3 = Gia_ManHashAnd(p,iVar4,iLit1);
          pGVar9->Value = uVar3;
        }
      }
      for (lVar13 = 0; lVar13 < *(int *)((long)plVar7 + 0x2c); lVar13 = lVar13 + 1) {
        if ((long)pGVar10->vCos->nSize - (long)pGVar10->nRegs <= lVar13) {
          __assert_fail("v < Gia_ManPoNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
        }
        plVar1 = *(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                           (long)*(int *)(plVar7[6] + lVar13 * 4) * 8);
        iVar2 = Vec_IntEntry(pGVar10->vCos,(int)lVar13);
        pGVar9 = Gia_ManObj(pGVar10,iVar2);
        iVar2 = Gia_ObjFanin0Copy(pGVar9);
        *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8) +
                0x40) = iVar2;
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive( Abc_Ntk_t * pNtk, Vec_Ptr_t * vOrder )
{
    int gFanins[16];
    Abc_Ntk_t * pNtkModel;
    Gia_Man_t * pGiaBox, * pGia = NULL;
    Gia_Obj_t * pGiaObj;
    Abc_Obj_t * pTerm, * pObj;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // start the network
    pGia = Gia_ManStart( (1<<15) );
    pGia->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );
    pGia->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk) );
    Gia_ManHashAlloc( pGia );
    // create PIs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = Gia_ManAppendCi( pGia );
    // recursively flatten hierarchy
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            char * pSop = (char *)pObj->pData;
            assert( Abc_ObjFaninNum(pObj) <= 16 );
            assert( Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop) );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                gFanins[k] = pTerm->iTemp;
                assert( gFanins[k] >= 0 );
            }
            Abc_ObjFanout0(pObj)->iTemp = Abc_NtkDeriveFlatGiaSop( pGia, gFanins, pSop );
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
/*
        // assign PIs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
        // call recursively
        Abc_NtkDeriveFlatGia_rec( pGia, pNtkModel );
        // assign POs
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->iTemp;
*/ 
        // duplicate the AIG
        pGiaBox = (Gia_Man_t *)pNtkModel->pData;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox) );
        assert( Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox) );
        Gia_ManFillValue( pGiaBox );
        Gia_ManConst0(pGiaBox)->Value = 0;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Gia_ManPi(pGiaBox, k)->Value = Abc_ObjFanin0(pTerm)->iTemp;
        Gia_ManForEachAnd( pGiaBox, pGiaObj, k )
            pGiaObj->Value = Gia_ManHashAnd( pGia, Gia_ObjFanin0Copy(pGiaObj), Gia_ObjFanin1Copy(pGiaObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Gia_ObjFanin0Copy(Gia_ManPo(pGiaBox, k));
    }
    // create POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pTerm)->iTemp );
    // prepare return value
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pGiaBox = pGia );
    Gia_ManStop( pGiaBox );

    printf( "%8d -> ", Abc_NtkCountAndNodes(vOrder) );
    Gia_ManPrintStats( pGia, NULL );
    return pGia;
}